

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O3

void cleanup_eff(void)

{
  blow_effect *pbVar1;
  blow_effect *pbVar2;
  blow_effect *p;
  
  pbVar2 = blow_effects;
  if (blow_effects == (blow_effect *)0x0) {
    p = (blow_effect *)0x0;
  }
  else {
    do {
      pbVar1 = pbVar2->next;
      string_free(pbVar2->effect_type);
      string_free(pbVar2->desc);
      string_free(pbVar2->name);
      pbVar2 = pbVar1;
      p = blow_effects;
    } while (pbVar1 != (blow_effect *)0x0);
  }
  mem_free(p);
  return;
}

Assistant:

static void cleanup_eff(void)
{
	struct blow_effect *eff = blow_effects;
	struct blow_effect *next;

	while (eff) {
		next = eff->next;
		string_free(eff->effect_type);
		string_free(eff->desc);
		string_free(eff->name);
		eff = next;
	}
	mem_free(blow_effects);
}